

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_switch.cpp
# Opt level: O0

void QtMWidgets::Switch::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  QColor *c;
  bool bVar2;
  State SVar3;
  QColor QVar4;
  void *_v_1;
  Switch *_t_2;
  undefined4 local_88;
  undefined2 uStack_84;
  QString local_70;
  QString local_58;
  QString *local_40;
  void *_v;
  Switch *_t_1;
  int *result;
  Switch *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (Switch *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    if (_id == 0) {
      toggled((Switch *)_o,(bool)(*_a[1] & 1));
    }
    else if (_id == 1) {
      stateChanged((Switch *)_o,*_a[1]);
    }
    else if (_id == 2) {
      setState((Switch *)_o,*_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == toggled && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    else {
      pcVar1 = *_a[1];
      if (pcVar1 == stateChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 1;
      }
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (QString *)*_a;
    _v = _o;
    switch(_id) {
    case 0:
      SVar3 = state((Switch *)_o);
      *(State *)&(local_40->d).d = SVar3;
      break;
    case 1:
      bVar2 = isChecked((Switch *)_o);
      *(bool *)&(local_40->d).d = bVar2;
      break;
    case 2:
      onText(&local_58,(Switch *)_o);
      QString::operator=(local_40,&local_58);
      QString::~QString(&local_58);
      break;
    case 3:
      offText(&local_70,(Switch *)_o);
      QString::operator=(local_40,&local_70);
      QString::~QString(&local_70);
      break;
    case 4:
      QVar4 = onColor((Switch *)_o);
      _t_2 = QVar4._0_8_;
      local_88 = QVar4.ct._4_4_;
      uStack_84 = QVar4.ct._8_2_;
      (local_40->d).d = (Data *)_t_2;
      *(undefined4 *)&(local_40->d).ptr = local_88;
      *(undefined2 *)((long)&(local_40->d).ptr + 4) = uStack_84;
    }
  }
  else if (_c == WriteProperty) {
    c = (QColor *)*_a;
    switch(_id) {
    case 0:
      setState((Switch *)_o,c->cspec);
      break;
    default:
      break;
    case 2:
      setOnText((Switch *)_o,(QString *)c);
      break;
    case 3:
      setOffText((Switch *)_o,(QString *)c);
      break;
    case 4:
      setOnColor((Switch *)_o,c);
    }
  }
  return;
}

Assistant:

void QtMWidgets::Switch::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setState((*reinterpret_cast< std::add_pointer_t<State>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Switch::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Switch::toggled)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Switch::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Switch::stateChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->isChecked(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->onText(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->offText(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->onColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setState(*reinterpret_cast< State*>(_v)); break;
        case 2: _t->setOnText(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setOffText(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setOnColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}